

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_INT RVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  REF_ADJ_ITEM pRVar10;
  ulong uVar11;
  int iVar12;
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  pRVar3 = ref_grid->cell[8];
  iVar8 = -1;
  uVar11 = 0xffffffff;
  if (-1 < node1) {
    pRVar4 = pRVar3->ref_adj;
    uVar11 = 0xffffffff;
    iVar8 = -1;
    if (node1 < pRVar4->nnode) {
      uVar1 = pRVar4->first[(uint)node1];
      uVar11 = 0xffffffff;
      iVar8 = -1;
      if ((long)(int)uVar1 != -1) {
        iVar8 = pRVar4->item[(int)uVar1].ref;
        uVar11 = (ulong)uVar1;
      }
    }
  }
  do {
    if ((int)uVar11 == -1) {
      iVar8 = -1;
      iVar6 = iVar8;
      if (node0 < 0) goto LAB_001a1bea;
      pRVar4 = pRVar3->ref_adj;
      iVar8 = -1;
      iVar6 = -1;
      if (pRVar4->nnode <= node0) goto LAB_001a1bea;
      iVar12 = pRVar4->first[(uint)node0];
      iVar8 = -1;
      iVar6 = -1;
      if (iVar12 == -1) goto LAB_001a1bea;
      pRVar10 = pRVar4->item;
      do {
        iVar8 = pRVar10[iVar12].ref;
        iVar6 = iVar12;
LAB_001a1bea:
        do {
          if (iVar6 == -1) {
            pRVar3 = ref_grid->cell[3];
            iVar8 = -1;
            uVar11 = 0xffffffff;
            if (-1 < node1) {
              pRVar4 = pRVar3->ref_adj;
              uVar11 = 0xffffffff;
              iVar8 = -1;
              if (node1 < pRVar4->nnode) {
                uVar1 = pRVar4->first[(uint)node1];
                uVar11 = 0xffffffff;
                iVar8 = -1;
                if ((long)(int)uVar1 != -1) {
                  iVar8 = pRVar4->item[(int)uVar1].ref;
                  uVar11 = (ulong)uVar1;
                }
              }
            }
            do {
              if ((int)uVar11 == -1) {
                RVar5 = -1;
                iVar8 = RVar5;
                if (node0 < 0) goto LAB_001a1d3f;
                pRVar4 = pRVar3->ref_adj;
                RVar5 = -1;
                iVar8 = -1;
                if (pRVar4->nnode <= node0) goto LAB_001a1d3f;
                iVar6 = pRVar4->first[(uint)node0];
                RVar5 = -1;
                iVar8 = -1;
                if (iVar6 == -1) goto LAB_001a1d3f;
                pRVar10 = pRVar4->item;
                do {
                  RVar5 = pRVar10[iVar6].ref;
                  iVar8 = iVar6;
LAB_001a1d3f:
                  do {
                    if (iVar8 == -1) {
                      *allowed = 1;
                      return 0;
                    }
                    iVar6 = pRVar3->node_per;
                    iVar12 = 0;
                    if (iVar6 < 1) {
                      iVar6 = 0;
                    }
                    while (iVar6 != iVar12) {
                      iVar7 = pRVar3->size_per * RVar5 + iVar12;
                      iVar12 = iVar12 + 1;
                      if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[iVar7]]) {
                        return 0;
                      }
                    }
                    pRVar10 = pRVar3->ref_adj->item;
                    iVar6 = pRVar10[iVar8].next;
                    RVar5 = -1;
                    iVar8 = iVar6;
                  } while (iVar6 == -1);
                } while( true );
              }
              iVar12 = 0;
              iVar6 = pRVar3->node_per;
              if (pRVar3->node_per < 1) {
                iVar6 = iVar12;
              }
              while (iVar6 != iVar12) {
                iVar7 = pRVar3->size_per * iVar8 + iVar12;
                iVar12 = iVar12 + 1;
                if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[iVar7]]) {
                  return 0;
                }
              }
              pRVar10 = pRVar3->ref_adj->item;
              uVar11 = (ulong)pRVar10[(int)uVar11].next;
              iVar8 = -1;
              if (uVar11 != 0xffffffffffffffff) {
                iVar8 = pRVar10[uVar11].ref;
              }
            } while( true );
          }
          iVar7 = 0;
          iVar12 = pRVar3->node_per;
          if (pRVar3->node_per < 1) {
            iVar12 = iVar7;
          }
          while (iVar12 != iVar7) {
            iVar9 = pRVar3->size_per * iVar8 + iVar7;
            iVar7 = iVar7 + 1;
            if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[iVar9]]) {
              return 0;
            }
          }
          pRVar10 = pRVar3->ref_adj->item;
          iVar12 = pRVar10[iVar6].next;
          iVar8 = -1;
          iVar6 = iVar12;
        } while (iVar12 == -1);
      } while( true );
    }
    iVar12 = 0;
    iVar6 = pRVar3->node_per;
    if (pRVar3->node_per < 1) {
      iVar6 = iVar12;
    }
    while (iVar6 != iVar12) {
      iVar7 = pRVar3->size_per * iVar8 + iVar12;
      iVar12 = iVar12 + 1;
      if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[iVar7]]) {
        return 0;
      }
    }
    pRVar10 = pRVar3->ref_adj->item;
    uVar11 = (ulong)pRVar10[(int)uVar11].next;
    iVar8 = -1;
    if (uVar11 != 0xffffffffffffffff) {
      iVar8 = pRVar10[uVar11].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_local_cell(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  /* may be able to relax node0 local if geom constraint is o.k. */

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  /* for parallel surf and twod */
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}